

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O3

void __thiscall QLocalSocket::setSocketOptions(QLocalSocket *this,SocketOptions option)

{
  long in_FS_OFFSET;
  QFlagsStorageHelper<QLocalSocket::SocketOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QLocalSocket::SocketOption>.i =
       (QFlagsStorage<QLocalSocket::SocketOption>)
       (QFlagsStorage<QLocalSocket::SocketOption>)
       option.super_QFlagsStorageHelper<QLocalSocket::SocketOption,_4>.
       super_QFlagsStorage<QLocalSocket::SocketOption>.i;
  if (*(int *)(*(long *)&this->field_0x8 + 0x1c8) == 0) {
    QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
    ::setValue((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                *)(*(long *)&this->field_0x8 + 0x200),(parameter_type)&local_c);
  }
  else {
    setSocketOptions();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocket::setSocketOptions(QLocalSocket::SocketOptions option)
{
    Q_D(QLocalSocket);
    if (d->state != UnconnectedState) {
        qWarning("QLocalSocket::setSocketOptions() called while not in unconnected state");
        return;
    }
    d->socketOptions = option;
}